

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_trunc.cpp
# Opt level: O1

timestamp_t
duckdb::DateTrunc::
UnaryFunction<duckdb::timestamp_t,duckdb::timestamp_t,duckdb::DateTrunc::MillisecondOperator>
          (timestamp_t input)

{
  bool bVar1;
  dtime_t time_00;
  timestamp_t tVar2;
  undefined1 auVar3 [16];
  int32_t hour;
  date_t date;
  int32_t micros;
  int32_t sec;
  int32_t min;
  dtime_t time;
  timestamp_t local_68;
  date_t local_60;
  int local_5c;
  int32_t local_58;
  int32_t local_54;
  string local_50;
  
  bVar1 = Value::IsFinite<duckdb::timestamp_t>(input);
  if (bVar1) {
    Timestamp::Convert(input,&local_60,(dtime_t *)&local_50);
    Time::Convert((dtime_t)local_50._M_dataplus._M_p,(int32_t *)&local_68,&local_54,&local_58,
                  &local_5c);
    local_5c = ((int)(SUB168(SEXT816((long)local_5c) * SEXT816(0x20c49ba5e353f7cf),8) >> 7) -
               (SUB164(SEXT816((long)local_5c) * SEXT816(0x20c49ba5e353f7cf),0xc) >> 0x1f)) * 1000;
    time_00 = Time::FromTime((int32_t)local_68.value,local_54,local_58,local_5c);
    tVar2 = Timestamp::FromDatetime(local_60,time_00);
  }
  else {
    bVar1 = TryCast::Operation<duckdb::timestamp_t,duckdb::timestamp_t>(input,&local_68,false);
    if (!bVar1) {
      auVar3 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::timestamp_t,duckdb::timestamp_t>
                (&local_50,(duckdb *)input.value,(timestamp_t)auVar3._8_8_);
      InvalidInputException::InvalidInputException(auVar3._0_8_,(string *)&local_50);
      __cxa_throw(auVar3._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
    tVar2.value = CONCAT44(local_68.value._4_4_,(int32_t)local_68.value);
  }
  return (timestamp_t)tVar2.value;
}

Assistant:

static inline TR UnaryFunction(TA input) {
		if (Value::IsFinite(input)) {
			return OP::template Operation<TA, TR>(input);
		} else {
			return Cast::template Operation<TA, TR>(input);
		}
	}